

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StableBlockVector.hpp
# Opt level: O1

iterator * __thiscall
gmlc::containers::StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_>::end
          (iterator *__return_storage_ptr__,
          StableBlockVector<helics::FedInfo,_5U,_std::allocator<helics::FedInfo>_> *this)

{
  int iVar1;
  int iVar2;
  FedInfo **ppFVar3;
  
  iVar2 = this->bsize;
  ppFVar3 = this->dataptr;
  if ((long)iVar2 == 0x20) {
    if (ppFVar3 == (FedInfo **)0x0) {
      ppFVar3 = &end::emptyValue;
    }
    else {
      ppFVar3 = ppFVar3 + (long)this->dataSlotIndex + 1;
    }
    __return_storage_ptr__->vec = ppFVar3;
    __return_storage_ptr__->ptr = *ppFVar3;
    iVar2 = 0;
  }
  else {
    iVar1 = this->dataSlotIndex;
    __return_storage_ptr__->vec = ppFVar3 + iVar1;
    __return_storage_ptr__->ptr = ppFVar3[iVar1] + iVar2;
  }
  __return_storage_ptr__->offset = iVar2;
  return __return_storage_ptr__;
}

Assistant:

iterator end()
        {
            static X* emptyValue{nullptr};
            if (bsize == blockSize) {
                X** ptr = (dataptr != nullptr) ? &(dataptr[dataSlotIndex + 1]) :
                                                 &emptyValue;
                return {ptr, 0};
            }
            X** ptr = &(dataptr[dataSlotIndex]);
            return {ptr, bsize};
        }